

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O0

ProString * __thiscall
ProString::append(ProString *this,ProStringList *other,bool *pending,bool skipEmpty1st)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  const_reference this_00;
  ProString *pPVar4;
  byte in_CL;
  byte *in_RDX;
  QList<ProString> *in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar5;
  ProString *str;
  int i;
  bool putSpace;
  int startIdx;
  int sz;
  ProString *in_stack_ffffffffffffff38;
  ProString *in_stack_ffffffffffffff40;
  const_reference in_stack_ffffffffffffff48;
  QChar c;
  QStringView *this_01;
  qsizetype in_stack_ffffffffffffff60;
  storage_type_conflict *in_stack_ffffffffffffff68;
  int local_84;
  int local_7c;
  ProString *local_58;
  qsizetype local_48;
  storage_type_conflict *local_40;
  QLatin1Char local_33 [27];
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QList<ProString>::size(in_RSI);
  iVar2 = (int)qVar3;
  local_58 = in_RDI;
  if (iVar2 != 0) {
    local_7c = 0;
    local_48 = in_stack_ffffffffffffff60;
    local_40 = in_stack_ffffffffffffff68;
    if (((in_RDX != (byte *)0x0) && ((*in_RDX & 1) == 0)) && ((in_CL & 1) != 0)) {
      this_00 = QList<ProString>::at
                          ((QList<ProString> *)in_stack_ffffffffffffff40,
                           (qsizetype)in_stack_ffffffffffffff38);
      bVar1 = isEmpty(this_00);
      local_48 = in_stack_ffffffffffffff60;
      local_40 = in_stack_ffffffffffffff68;
      if (bVar1) {
        local_58 = in_RDI;
        if (iVar2 == 1) goto LAB_0032f242;
        local_7c = 1;
      }
    }
    if ((in_RDI->m_length == 0) && (iVar2 == local_7c + 1)) {
      QList<ProString>::at
                ((QList<ProString> *)in_stack_ffffffffffffff40,(qsizetype)in_stack_ffffffffffffff38)
      ;
      operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    else {
      bVar1 = false;
      if ((in_RDX != (byte *)0x0) && (((*in_RDX & 1) == 0 && (in_RDI->m_length != 0)))) {
        bVar1 = true;
      }
      toQString(in_stack_ffffffffffffff38);
      QString::operator=(&in_stack_ffffffffffffff40->m_string,&in_stack_ffffffffffffff38->m_string);
      QString::~QString((QString *)0x32f0c4);
      in_RDI->m_offset = 0;
      for (local_84 = local_7c; c.ucs = (char16_t)((ulong)in_stack_ffffffffffffff48 >> 0x30),
          local_84 < iVar2; local_84 = local_84 + 1) {
        if (bVar1) {
          QLatin1Char::QLatin1Char(local_33,' ');
          QChar::QChar<QLatin1Char,_true>
                    ((QChar *)in_stack_ffffffffffffff40,(QLatin1Char)(char)((ushort)c.ucs >> 8));
          QString::operator+=(&in_stack_ffffffffffffff40->m_string,c);
        }
        else {
          bVar1 = true;
        }
        in_stack_ffffffffffffff48 =
             QList<ProString>::at
                       ((QList<ProString> *)in_stack_ffffffffffffff40,
                        (qsizetype)in_stack_ffffffffffffff38);
        this_01 = &local_18;
        QStringView::QStringView<QString,_true>(this_01,&in_stack_ffffffffffffff48->m_string);
        QVar5 = QStringView::mid((QStringView *)in_RDI,(qsizetype)local_40,local_48);
        local_48 = QVar5.m_size;
        local_40 = QVar5.m_data;
        QVar5.m_data = (storage_type_conflict *)in_RDI;
        QVar5.m_size = (qsizetype)this_01;
        QString::operator+=(&in_stack_ffffffffffffff38->m_string,QVar5);
      }
      qVar3 = QString::size(&in_RDI->m_string);
      in_RDI->m_length = (int)qVar3;
      pPVar4 = QList<ProString>::last((QList<ProString> *)in_stack_ffffffffffffff38);
      if (pPVar4->m_file != 0) {
        pPVar4 = QList<ProString>::last((QList<ProString> *)in_stack_ffffffffffffff38);
        in_RDI->m_file = pPVar4->m_file;
      }
      in_RDI->m_hash = 0x80000000;
    }
    local_58 = in_RDI;
    if (in_RDX != (byte *)0x0) {
      *in_RDX = 1;
    }
  }
LAB_0032f242:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

ProString &ProString::append(const ProStringList &other, bool *pending, bool skipEmpty1st)
{
    if (const int sz = other.size()) {
        int startIdx = 0;
        if (pending && !*pending && skipEmpty1st && other.at(0).isEmpty()) {
            if (sz == 1)
                return *this;
            startIdx = 1;
        }
        if (!m_length && sz == startIdx + 1) {
            *this = other.at(startIdx);
        } else {
            bool putSpace = false;
            if (pending && !*pending && m_length)
                putSpace = true;

            m_string = toQString();
            m_offset = 0;
            for (int i = startIdx; i < sz; ++i) {
                if (putSpace)
                    m_string += QLatin1Char(' ');
                else
                    putSpace = true;
                const ProString &str = other.at(i);
                m_string += str.toQStringView();
            }
            m_length = m_string.size();
            if (other.last().m_file)
                m_file = other.last().m_file;
            m_hash = 0x80000000;
        }
        if (pending)
            *pending = true;
    }
    return *this;
}